

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

void lydxml_get_hints_opaq
               (char *name,size_t name_len,char *value,size_t value_len,lyd_node *first,char *ns,
               uint32_t *hints,lyd_node **anchor)

{
  int iVar1;
  longlong lVar2;
  longlong num;
  char *ptr;
  lyd_node_opaq *opaq;
  char *ns_local;
  lyd_node *first_local;
  size_t value_len_local;
  char *value_local;
  size_t name_len_local;
  char *name_local;
  
  *hints = 0;
  *anchor = (lyd_node *)0x0;
  opaq = (lyd_node_opaq *)ns;
  ns_local = (char *)first;
  first_local = (lyd_node *)value_len;
  value_len_local = (size_t)value;
  value_local = (char *)name_len;
  name_len_local = (size_t)name;
  if (value_len == 0) {
    *hints = *hints | 0x41;
  }
  else {
    iVar1 = strncmp(value,"true",value_len);
    if ((iVar1 == 0) ||
       (iVar1 = strncmp((char *)value_len_local,"false",(size_t)first_local), iVar1 == 0)) {
      *hints = *hints | 0x20;
      first = (lyd_node *)ns_local;
    }
    else {
      lVar2 = strtoll((char *)value_len_local,(char **)&num,10);
      first = (lyd_node *)ns_local;
      if ((lyd_node *)(ulong)(uint)((int)num - (int)value_len_local) == first_local) {
        *hints = *hints | 2;
        if ((lVar2 < -0x80000000) || (0xffffffff < lVar2)) {
          *hints = *hints | 0x10;
        }
      }
      else {
        *hints = *hints | 1;
      }
    }
  }
  do {
    if (first == (lyd_node *)0x0) {
      return;
    }
    ptr = (char *)((lyd_node *)ns_local)->prev;
    ns_local = ptr;
    if (((lyd_node *)ptr)->schema == (lysc_node *)0x0) {
      if (*(int *)((long)&((lyd_node *)((long)ptr + 0x38))->meta + 4) != 3) {
        __assert_fail("opaq->format == LY_VALUE_XML",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x201,
                      "void lydxml_get_hints_opaq(const char *, size_t, const char *, size_t, const struct lyd_node *, const char *, uint32_t *, struct lyd_node **)"
                     );
      }
      iVar1 = ly_strncmp((char *)((lyd_node *)((long)ptr + 0x38))->schema,(char *)name_len_local,
                         (size_t)value_local);
      if ((iVar1 == 0) &&
         ((((opaq != (lyd_node_opaq *)0x0 && (*(long *)(ptr + 0x50) != 0)) &&
           (iVar1 = strcmp(*(char **)(ptr + 0x50),(char *)opaq), iVar1 == 0)) ||
          ((opaq == (lyd_node_opaq *)0x0 && (*(long *)(ptr + 0x50) == 0)))))) {
        if ((*(long *)(ptr + 0x58) == 0) || (**(char **)(ptr + 0x58) == '\0')) {
          *(uint *)(ptr + 0x60) = *(uint *)(ptr + 0x60) | 0x80;
          *hints = *hints | 0x80;
        }
        else {
          *(uint *)(ptr + 0x60) = *(uint *)(ptr + 0x60) | 0x100;
          *hints = *hints | 0x100;
        }
        *anchor = (lyd_node *)ns_local;
        return;
      }
    }
    first = *(lyd_node **)(*(long *)(ns_local + 0x20) + 0x18);
  } while( true );
}

Assistant:

static void
lydxml_get_hints_opaq(const char *name, size_t name_len, const char *value, size_t value_len, const struct lyd_node *first,
        const char *ns, uint32_t *hints, struct lyd_node **anchor)
{
    struct lyd_node_opaq *opaq;
    char *ptr;
    /* this needs to be at least 64bit, and it "should not" be an explicit int64_t
     * because the code calls strtoll later on, which "might" return a bigger type */
    long long num;

    *hints = 0;
    *anchor = NULL;

    if (!value_len) {
        /* no value but it may also be zero-length string */
        *hints |= LYD_VALHINT_EMPTY | LYD_VALHINT_STRING;
    } else if (!strncmp(value, "true", value_len) || !strncmp(value, "false", value_len)) {
        /* boolean value */
        *hints |= LYD_VALHINT_BOOLEAN;
    } else {
        num = strtoll(value, &ptr, 10);
        if ((unsigned)(ptr - value) == value_len) {
            /* number value */
            *hints |= LYD_VALHINT_DECNUM;
            if ((num < INT32_MIN) || (num > UINT32_MAX)) {
                /* large number */
                *hints |= LYD_VALHINT_NUM64;
            }
        } else {
            /* string value */
            *hints |= LYD_VALHINT_STRING;
        }
    }

    if (!first) {
        return;
    }

    /* search backwards to find the last instance */
    do {
        first = first->prev;
        if (first->schema) {
            continue;
        }

        opaq = (struct lyd_node_opaq *)first;
        assert(opaq->format == LY_VALUE_XML);
        if (!ly_strncmp(opaq->name.name, name, name_len) &&
                ((ns && opaq->name.module_ns && !strcmp(opaq->name.module_ns, ns)) || (!ns && !opaq->name.module_ns))) {
            if (opaq->value && opaq->value[0]) {
                /* leaf-list nodes */
                opaq->hints |= LYD_NODEHINT_LEAFLIST;
                *hints |= LYD_NODEHINT_LEAFLIST;
            } else {
                /* list nodes */
                opaq->hints |= LYD_NODEHINT_LIST;
                *hints |= LYD_NODEHINT_LIST;
            }
            *anchor = (struct lyd_node *)first;
            break;
        }
    } while (first->prev->next);
}